

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVectorEnumerator.cpp
# Opt level: O0

void __thiscall
JsUtil::FBVEnumerator::FBVEnumerator(FBVEnumerator *this,BVUnit *iterStart,BVUnit *iterEnd)

{
  BVUnit *iterEnd_local;
  BVUnit *iterStart_local;
  FBVEnumerator *this_local;
  
  this->icur = iterStart;
  this->iend = iterEnd;
  this->curOffset = 0;
  BVUnitT<unsigned_long>::BVUnitT(&this->curUnit,0);
  if (this->icur != this->iend) {
    (this->curUnit).word = iterStart->word;
    MoveToNextBit(this);
  }
  return;
}

Assistant:

FBVEnumerator::FBVEnumerator(BVUnit * iterStart, BVUnit * iterEnd):
        icur(iterStart), iend(iterEnd),
        curOffset(0)
    {
        if(this->icur != this->iend)
        {
            this->curUnit = *iterStart;
            this->MoveToNextBit();
        }
    }